

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Group.c
# Opt level: O3

void Llb_ManGroupStop(Llb_Grp_t *p)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  
  if (p == (Llb_Grp_t *)0x0) {
    return;
  }
  iVar1 = p->Id;
  if (((long)iVar1 < 0) || (pVVar2 = p->pMan->vGroups, pVVar2->nSize <= iVar1)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                  ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
  }
  pVVar2->pArray[iVar1] = (void *)0x0;
  pVVar2 = p->vIns;
  if (pVVar2 != (Vec_Ptr_t *)0x0) {
    if (pVVar2->pArray != (void **)0x0) {
      free(pVVar2->pArray);
      p->vIns->pArray = (void **)0x0;
      pVVar2 = p->vIns;
      if (pVVar2 == (Vec_Ptr_t *)0x0) goto LAB_00821fb8;
    }
    free(pVVar2);
    p->vIns = (Vec_Ptr_t *)0x0;
  }
LAB_00821fb8:
  pVVar2 = p->vOuts;
  if (pVVar2 != (Vec_Ptr_t *)0x0) {
    if (pVVar2->pArray != (void **)0x0) {
      free(pVVar2->pArray);
      p->vOuts->pArray = (void **)0x0;
      pVVar2 = p->vOuts;
      if (pVVar2 == (Vec_Ptr_t *)0x0) goto LAB_00821ff4;
    }
    free(pVVar2);
    p->vOuts = (Vec_Ptr_t *)0x0;
  }
LAB_00821ff4:
  pVVar2 = p->vNodes;
  if (pVVar2 != (Vec_Ptr_t *)0x0) {
    if (pVVar2->pArray != (void **)0x0) {
      free(pVVar2->pArray);
      p->vNodes->pArray = (void **)0x0;
      pVVar2 = p->vNodes;
      if (pVVar2 == (Vec_Ptr_t *)0x0) goto LAB_00822028;
    }
    free(pVVar2);
  }
LAB_00822028:
  free(p);
  return;
}

Assistant:

void Llb_ManGroupStop( Llb_Grp_t * p )
{
    if ( p == NULL )
        return;
    Vec_PtrWriteEntry( p->pMan->vGroups, p->Id, NULL );
    Vec_PtrFreeP( &p->vIns );
    Vec_PtrFreeP( &p->vOuts );
    Vec_PtrFreeP( &p->vNodes );
    ABC_FREE( p );
}